

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall glslang::HlslParseContext::fixBuiltInIoType(HlslParseContext *this,TType *type)

{
  int iVar1;
  uint uVar2;
  TBasicType t;
  undefined4 extraout_var;
  TPoolAllocator *this_00;
  TArraySizes *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar3;
  undefined8 *puVar4;
  TQualifier *pTVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  TType newType;
  TType local_c0;
  
  bVar8 = 0;
  iVar1 = (*type->_vptr_TType[10])(type);
  uVar2 = *(uint *)(CONCAT44(extraout_var,iVar1) + 8) >> 7 & 0x1ff;
  if (uVar2 < 0x38) {
    if (2 < uVar2 - 3) {
LAB_0037eb2b:
      iVar1 = (*type->_vptr_TType[0xb])(type);
      if (1 < (*(uint *)(CONCAT44(extraout_var_02,iVar1) + 8) >> 7 & 0x1ff) - 0x21) {
        return;
      }
      iVar1 = (*type->_vptr_TType[10])(type);
      uVar7 = (uint)*(undefined8 *)(CONCAT44(extraout_var_03,iVar1) + 0x1c) & 0xfff;
      iVar1 = (*type->_vptr_TType[10])(type);
      uVar2 = *(uint *)(CONCAT44(extraout_var_04,iVar1) + 8);
      iVar1 = (*type->_vptr_TType[10])(type);
      uVar6 = (uint)*(undefined8 *)(CONCAT44(extraout_var_05,iVar1) + 8) & 0x7f;
      iVar1 = (*type->_vptr_TType[0xc])(type);
      if ((uVar2 & 0xff80) == 0x1080) {
        if (uVar6 == 3) {
          (this->clipSemanticNSizeIn)._M_elems[uVar7] = iVar1;
          return;
        }
        (this->clipSemanticNSizeOut)._M_elems[uVar7] = iVar1;
        return;
      }
      if (uVar6 == 3) {
        (this->cullSemanticNSizeIn)._M_elems[uVar7] = iVar1;
        return;
      }
      (this->cullSemanticNSizeOut)._M_elems[uVar7] = iVar1;
      return;
    }
LAB_0037eabc:
    t = (*type->_vptr_TType[7])(type);
    iVar1 = (*type->_vptr_TType[10])(type);
    TType::TType(&local_c0,t,*(TStorageQualifier *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f,3,0,
                 0,false);
    iVar1 = (*type->_vptr_TType[10])(type);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_01,iVar1);
    pTVar5 = &local_c0.qualifier;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pTVar5->semanticName = (char *)*puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      pTVar5 = (TQualifier *)((long)pTVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    TType::shallowCopy(type,&local_c0);
  }
  else {
    if (uVar2 < 0x3b) {
      uVar6 = 4;
      if (uVar2 != 0x38) {
        if (uVar2 != 0x39) goto LAB_0037eb2b;
        uVar6 = 2;
      }
    }
    else {
      if (uVar2 == 0x3b) goto LAB_0037eabc;
      if (uVar2 != 0x47) goto LAB_0037eb2b;
      iVar1 = (*type->_vptr_TType[0x1d])(type);
      if ((char)iVar1 != '\0') {
        return;
      }
      uVar6 = 1;
    }
    iVar1 = (*type->_vptr_TType[0x1d])(type);
    if (((char)iVar1 == '\0') || (uVar2 = (*type->_vptr_TType[0xf])(type), uVar2 != uVar6)) {
      this_00 = GetThreadPoolAllocator();
      this_01 = (TArraySizes *)TPoolAllocator::allocate(this_00,0x18);
      (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_009237c8;
      (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      this_01->implicitArraySize = 0;
      this_01->implicitlySized = true;
      this_01->variablyIndexed = false;
      TSmallArrayVector::push_back((TSmallArrayVector *)this_01,uVar6,(TIntermTyped *)0x0);
      type->arraySizes = this_01;
    }
  }
  return;
}

Assistant:

void HlslParseContext::fixBuiltInIoType(TType& type)
{
    int requiredArraySize = 0;
    int requiredVectorSize = 0;

    switch (type.getQualifier().builtIn) {
    case EbvTessLevelOuter: requiredArraySize = 4; break;
    case EbvTessLevelInner: requiredArraySize = 2; break;

    case EbvSampleMask:
        {
            // Promote scalar to array of size 1.  Leave existing arrays alone.
            if (!type.isArray())
                requiredArraySize = 1;
            break;
        }

    case EbvWorkGroupId:        requiredVectorSize = 3; break;
    case EbvGlobalInvocationId: requiredVectorSize = 3; break;
    case EbvLocalInvocationId:  requiredVectorSize = 3; break;
    case EbvTessCoord:          requiredVectorSize = 3; break;

    default:
        if (isClipOrCullDistance(type)) {
            const int loc = type.getQualifier().layoutLocation;

            if (type.getQualifier().builtIn == EbvClipDistance) {
                if (type.getQualifier().storage == EvqVaryingIn)
                    clipSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    clipSemanticNSizeOut[loc] = type.getVectorSize();
            } else {
                if (type.getQualifier().storage == EvqVaryingIn)
                    cullSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    cullSemanticNSizeOut[loc] = type.getVectorSize();
            }
        }

        return;
    }

    // Alter or set vector size as needed.
    if (requiredVectorSize > 0) {
        TType newType(type.getBasicType(), type.getQualifier().storage, requiredVectorSize);
        newType.getQualifier() = type.getQualifier();

        type.shallowCopy(newType);
    }

    // Alter or set array size as needed.
    if (requiredArraySize > 0) {
        if (!type.isArray() || type.getOuterArraySize() != requiredArraySize) {
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(requiredArraySize);
            type.transferArraySizes(arraySizes);
        }
    }
}